

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O0

int __thiscall serial::Serial::SerialImpl::close(SerialImpl *this,int __fd)

{
  byte bVar1;
  IOException *this_00;
  int *piVar2;
  SerialImpl *pSVar3;
  allocator<char> local_39;
  string local_38;
  int local_14;
  SerialImpl *pSStack_10;
  int ret;
  SerialImpl *this_local;
  
  bVar1 = this->is_open_ & 1;
  pSVar3 = (SerialImpl *)(ulong)bVar1;
  if (bVar1 == 1) {
    if (this->fd_ != -1) {
      pSStack_10 = this;
      local_14 = ::close(this->fd_);
      if (local_14 != 0) {
        this_00 = (IOException *)__cxa_allocate_exception(0x78);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]serial/src/impl/unix.cc"
                   ,&local_39);
        piVar2 = __errno_location();
        IOException::IOException(this_00,&local_38,0x1d3,*piVar2);
        __cxa_throw(this_00,&IOException::typeinfo,IOException::~IOException);
      }
      this->fd_ = -1;
    }
    this->is_open_ = false;
    pSVar3 = this;
  }
  return (int)pSVar3;
}

Assistant:

void
Serial::SerialImpl::close ()
{
  if (is_open_ == true) {
    if (fd_ != -1) {
      int ret;
      ret = ::close (fd_);
      if (ret == 0) {
        fd_ = -1;
      } else {
        THROW (IOException, errno);
      }
    }
    is_open_ = false;
  }
}